

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cpp
# Opt level: O2

void __thiscall Display::updateCursor(Display *this)

{
  element_type *peVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  Minefield local_80;
  
  iVar3 = Controller::getX(&this->controller);
  uVar4 = Controller::getY(&this->controller);
  peVar1 = (this->io).super___shared_ptr<IODevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*peVar1->_vptr_IODevice[6])(peVar1,(ulong)(iVar3 * 2 + 1),(ulong)uVar4);
  Controller::getMinefield(&local_80,&this->controller);
  bVar2 = Minefield::isGameEnded(&local_80);
  Minefield::~Minefield(&local_80);
  peVar1 = (this->io).super___shared_ptr<IODevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*peVar1->_vptr_IODevice[7])(peVar1,(ulong)!bVar2);
  return;
}

Assistant:

void Display::updateCursor() {
    int x, y;
    std::tie(x, y) = getConsolePosition(controller.getX(), controller.getY());
    io->moveCursor(x, y);

    if (controller.getMinefield().isGameEnded()) {
        io->setCursorVisibility(0);
    } else {
        io->setCursorVisibility(1);
    }
}